

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeAddedConstants::doWalkFunction(OptimizeAddedConstants *this,Function *func)

{
  bool bVar1;
  PassOptions *pPVar2;
  Fatal *this_00;
  Module *pMVar3;
  unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_> local_1b8 [3];
  Fatal local_1a0;
  Module *local_18;
  Function *func_local;
  OptimizeAddedConstants *this_local;
  
  local_18 = (Module *)func;
  func_local = (Function *)this;
  pPVar2 = Pass::getPassOptions((Pass *)this);
  if ((pPVar2->lowMemoryUnused & 1U) != 0) {
    pMVar3 = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                          .
                          super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        );
    bVar1 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::empty(&pMVar3->memories);
    if (!bVar1) {
      while( true ) {
        this->propagated = false;
        std::
        map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
        ::clear(&this->helperIndexes);
        std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
        clear(&this->propagatable);
        if ((this->propagate & 1U) != 0) {
          Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
          ::getModule(&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                       .
                       super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                     );
          std::make_unique<wasm::LazyLocalGraph,wasm::Function*&,wasm::Module*>
                    ((Function **)local_1b8,&local_18);
          std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
          operator=(&this->localGraph,local_1b8);
          std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
          ~unique_ptr(local_1b8);
          findPropagatable(this);
        }
        Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
        ::doWalkFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                          .
                          super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                         ,(Function *)local_18);
        bVar1 = std::
                map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
                ::empty(&this->helperIndexes);
        if (!bVar1) {
          createHelperIndexes(this);
        }
        if ((this->propagated & 1U) == 0) break;
        cleanUpAfterPropagation(this);
      }
    }
    return;
  }
  Fatal::Fatal(&local_1a0);
  this_00 = Fatal::operator<<(&local_1a0,
                              (char (*) [49])"OptimizeAddedConstants can only be run when the ");
  Fatal::operator<<(this_00,(char (*) [33])"--low-memory-unused flag is set.");
  Fatal::~Fatal(&local_1a0);
}

Assistant:

void doWalkFunction(Function* func) {
    if (!getPassOptions().lowMemoryUnused) {
      Fatal() << "OptimizeAddedConstants can only be run when the "
              << "--low-memory-unused flag is set.";
    }

    if (getModule()->memories.empty()) {
      // There can be no loads and stores without a memory.
      return;
    }

    // Multiple passes may be needed if we have x + 4 + 8 etc. (nested structs
    // in C can cause this, but it's rare). Note that we only need that for the
    // propagation case (as 4 + 8 would be optimized directly if it were
    // adjacent).
    while (1) {
      propagated = false;
      helperIndexes.clear();
      propagatable.clear();
      if (propagate) {
        localGraph = std::make_unique<LazyLocalGraph>(func, getModule());
        findPropagatable();
      }
      Super::doWalkFunction(func);
      if (!helperIndexes.empty()) {
        createHelperIndexes();
      }
      if (propagated) {
        cleanUpAfterPropagation();
      } else {
        return;
      }
    }
  }